

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode::TreeEnsembleParameters_TreeNode
          (TreeEnsembleParameters_TreeNode *this,TreeEnsembleParameters_TreeNode *from)

{
  InternalMetadataWithArenaLite *this_00;
  TreeEnsembleParameters_TreeNode *from_local;
  TreeEnsembleParameters_TreeNode *this_local;
  Container *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__TreeEnsembleParameters_TreeNode_00d5dbf0;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  google::protobuf::
  RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>::
  RepeatedPtrField(&this->evaluationinfo_,&from->evaluationinfo_);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,&local_20->unknown_fields);
  }
  memcpy(&this->treeid_,&from->treeid_,0x40);
  return;
}

Assistant:

TreeEnsembleParameters_TreeNode::TreeEnsembleParameters_TreeNode(const TreeEnsembleParameters_TreeNode& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      evaluationinfo_(from.evaluationinfo_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&treeid_, &from.treeid_,
    reinterpret_cast<char*>(&relativehitrate_) -
    reinterpret_cast<char*>(&treeid_) + sizeof(relativehitrate_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.TreeEnsembleParameters.TreeNode)
}